

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasmbox.c
# Opt level: O1

int parse_export_section(wasmbox_input_stream_t *ins,wasm_u64_t section_size,wasmbox_module_t *mod)

{
  byte bVar1;
  wasm_u64_t wVar2;
  wasm_u64_t wVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  wasmbox_name_t *local_38;
  
  wVar2 = wasmbox_parse_unsigned_leb128(ins->data + ins->index,&ins->index,ins->length);
  bVar5 = wVar2 != 0;
  if (bVar5) {
    uVar4 = 1;
    do {
      parse_name(ins,&local_38);
      bVar1 = wasmbox_input_stream_read_u8(ins);
      if (bVar1 < 4) {
        wVar3 = wasmbox_parse_unsigned_leb128(ins->data + ins->index,&ins->index,ins->length);
        if (bVar1 == 0) {
          mod->functions[wVar3 & 0xffffffff]->name = local_38;
        }
        else {
          wasmbox_free(local_38);
        }
      }
      else {
        parse_export_section_cold_1();
      }
      if (3 < bVar1) break;
      bVar5 = uVar4 < wVar2;
      bVar6 = uVar4 != wVar2;
      uVar4 = uVar4 + 1;
    } while (bVar6);
  }
  return -(uint)bVar5;
}

Assistant:

static int parse_export_section(wasmbox_input_stream_t *ins,
                                wasm_u64_t section_size,
                                wasmbox_module_t *mod) {
  wasm_u64_t len = wasmbox_parse_unsigned_leb128(ins->data + ins->index,
                                                 &ins->index, ins->length);
  for (wasm_u64_t i = 0; i < len; i++) {
    if (parse_export_entry(ins, mod) != 0) {
      return -1;
    }
  }
  return 0;
}